

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall
slang::driver::Driver::processCommandFile(Driver *this,string_view fileName,bool makeRelative)

{
  string_view argList;
  string_view text;
  bool bVar1;
  element_type *peVar2;
  char *__str;
  size_type __len;
  char *extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  sVar3;
  string_view sVar4;
  format_args args;
  format_args args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_410 [2];
  string local_400;
  string_view local_3e0;
  iterator local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err;
  iterator __end3;
  iterator __begin3;
  size_type local_3b0;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  *local_3a8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  *__range3;
  size_t local_398;
  size_t sStack_390;
  byte local_379;
  undefined1 auStack_378 [7];
  bool result;
  string_view argStr;
  undefined1 local_360 [4];
  ParseOptions parseOpts;
  path local_338;
  undefined1 local_310 [8];
  path currPath;
  v9 *local_2e0 [2];
  string local_2d0;
  string_view local_2b0;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  color_type local_28c;
  text_style local_284;
  undefined1 local_270 [8];
  vector<char,_std::allocator<char>_> buffer;
  string_view local_230;
  path local_220;
  undefined1 local_1f8 [8];
  path path;
  error_code ec;
  bool makeRelative_local;
  Driver *this_local;
  string_view fileName_local;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_198 [2];
  undefined1 local_188 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  char *local_170;
  iterator local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  char *pcStack_158;
  string *local_150;
  char *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_140;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_138 [3];
  undefined1 local_120 [16];
  v9 *local_110;
  char *local_108;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_100;
  v9 *local_f8;
  char *pcStack_f0;
  string *local_e8;
  char *local_e0;
  v9 **local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  char *pcStack_c0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  char *local_88;
  v9 **local_80;
  char *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_70;
  char *local_68;
  v9 **local_60;
  v9 *local_58;
  char *pcStack_50;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  char *local_10;
  
  fileName_local._M_len = (size_t)fileName._M_str;
  this_local = (Driver *)fileName._M_len;
  std::error_code::error_code((error_code *)&path._M_cmpts);
  sVar4._M_str = extraout_RDX;
  sVar4._M_len = fileName_local._M_len;
  local_230 = widen((slang *)this_local,sVar4);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_220,&local_230,auto_format);
  std::filesystem::canonical((path *)local_1f8,(error_code *)&local_220);
  std::filesystem::__cxx11::path::~path(&local_220);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_270)
  ;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&path._M_cmpts);
  if ((bVar1) ||
     (bVar1 = OS::readFile((path *)local_1f8,(vector<char,_std::allocator<char>_> *)local_270),
     !bVar1)) {
    peVar2 = std::
             __shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->diagClient);
    ::fmt::v9::detail::color_type::color_type(&local_28c,peVar2->errorColor);
    ::fmt::v9::fg(&local_284,local_28c);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a0,"error: ");
    text._M_str = local_2a0._M_str;
    text._M_len = local_2a0._M_len;
    OS::printE(&local_284,text);
    local_d8 = local_2e0;
    local_e0 = "no such file or directory: \'{}\'\n";
    local_88 = "no such file or directory: \'{}\'\n";
    local_2e0[0] = (v9 *)0x6d852b;
    local_80 = local_d8;
    local_108 = (char *)std::char_traits<char>::length("no such file or directory: \'{}\'\n");
    local_10 = local_e0;
    local_e8 = &local_2d0;
    local_f8 = local_2e0[0];
    local_100 = (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 *)&this_local;
    local_60 = &local_f8;
    local_110 = local_2e0[0];
    pcStack_f0 = local_108;
    local_58 = local_110;
    pcStack_50 = local_108;
    local_138[0] = ::fmt::v9::
                   make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::basic_string_view<char,std::char_traits<char>>&>
                             (local_100,(v9 *)local_2a0._M_len,
                              (basic_string_view<char,_std::char_traits<char>_> *)local_e8);
    local_38 = local_120;
    local_40 = local_138;
    local_20 = 0xd;
    fmt.size_ = 0xd;
    fmt.data_ = local_108;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_40;
    local_30 = local_40;
    local_28 = local_40;
    local_18 = local_38;
    ::fmt::v9::vformat_abi_cxx11_(&local_2d0,local_110,fmt,args);
    local_2b0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2d0);
    OS::printE(local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    fileName_local._M_str._7_1_ = 0;
    currPath._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._4_4_
         = 1;
  }
  else {
    std::filesystem::__cxx11::path::path((path *)local_310);
    if (makeRelative) {
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::__cxx11::path::operator=((path *)local_310,&local_338);
      std::filesystem::__cxx11::path::~path(&local_338);
      std::filesystem::__cxx11::path::parent_path();
      std::filesystem::current_path((path *)local_360);
      std::filesystem::__cxx11::path::~path((path *)local_360);
    }
    CommandLine::ParseOptions::ParseOptions((ParseOptions *)((long)&argStr._M_str + 4));
    argStr._M_str._4_1_ = true;
    argStr._M_str._5_1_ = true;
    argStr._M_str._6_1_ = true;
    argStr._M_str._7_1_ = true;
    bVar1 = std::vector<char,_std::allocator<char>_>::empty
                      ((vector<char,_std::allocator<char>_> *)local_270);
    if (bVar1) {
      assert::assertFailed
                ("!buffer.empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/driver/Driver.cpp"
                 ,0xfd,"bool slang::driver::Driver::processCommandFile(string_view, bool)");
    }
    std::vector<char,_std::allocator<char>_>::pop_back
              ((vector<char,_std::allocator<char>_> *)local_270);
    __str = std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)local_270);
    __len = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_270);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_378,__str,__len);
    local_398 = _auStack_378;
    sStack_390 = argStr._M_len;
    __range3._4_4_ = argStr._M_str._4_4_;
    argList._M_str = (char *)argStr._M_len;
    argList._M_len = _auStack_378;
    local_379 = CommandLine::parse(&this->cmdLine,argList,argStr._M_str._4_4_);
    if (makeRelative) {
      std::filesystem::current_path((path *)local_310);
    }
    if ((local_379 & 1) == 0) {
      sVar3 = CommandLine::getErrors_abi_cxx11_(&this->cmdLine);
      local_3b0 = sVar3.size_;
      __begin3 = sVar3.data_;
      local_3a8 = (span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
                   *)&__begin3;
      __end3 = nonstd::span_lite::
               span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
               ::begin(local_3a8);
      err = nonstd::span_lite::
            span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
            ::end(local_3a8);
      for (; __end3 != err; __end3 = __end3 + 1) {
        local_3d0 = __end3;
        local_140 = local_410;
        local_148 = "{}\n";
        local_78 = "{}\n";
        local_410[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6d8716
        ;
        local_70 = local_140;
        local_170 = (char *)std::char_traits<char>::length("{}\n");
        local_68 = local_148;
        local_150 = &local_400;
        local_160 = local_410[0];
        local_168 = local_3d0;
        local_d0 = &local_160;
        local_178 = local_410[0];
        pcStack_158 = local_170;
        local_c8 = local_178;
        pcStack_c0 = local_170;
        local_198[0] = ::fmt::v9::
                       make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string_const&>
                                 ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_3d0,(v9 *)local_150,local_410[0]);
        local_b0 = local_188;
        local_b8 = local_198;
        local_98 = 0xd;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = local_170;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_b8;
        local_a8 = local_b8;
        local_a0 = local_b8;
        local_90 = local_b0;
        ::fmt::v9::vformat_abi_cxx11_(&local_400,(v9 *)local_178,fmt_00,args_00);
        sVar4 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_400);
        local_3e0 = sVar4;
        OS::printE(sVar4);
        std::__cxx11::string::~string((string *)&local_400);
      }
      fileName_local._M_str._7_1_ = 0;
    }
    else {
      fileName_local._M_str._7_1_ = 1;
    }
    currPath._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._4_4_
         = 1;
    std::filesystem::__cxx11::path::~path((path *)local_310);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_270);
  std::filesystem::__cxx11::path::~path((path *)local_1f8);
  return (bool)(fileName_local._M_str._7_1_ & 1);
}

Assistant:

bool Driver::processCommandFile(string_view fileName, bool makeRelative) {
    std::error_code ec;
    fs::path path = fs::canonical(widen(fileName), ec);
    std::vector<char> buffer;
    if (ec || !OS::readFile(path, buffer)) {
        OS::printE(fg(diagClient->errorColor), "error: ");
        OS::printE(fmt::format("no such file or directory: '{}'\n", fileName));
        return false;
    }

    fs::path currPath;
    if (makeRelative) {
        currPath = fs::current_path();
        fs::current_path(path.parent_path());
    }

    CommandLine::ParseOptions parseOpts;
    parseOpts.expandEnvVars = true;
    parseOpts.ignoreProgramName = true;
    parseOpts.supportComments = true;
    parseOpts.ignoreDuplicates = true;

    ASSERT(!buffer.empty());
    buffer.pop_back();

    string_view argStr(buffer.data(), buffer.size());
    bool result = cmdLine.parse(argStr, parseOpts);

    if (makeRelative)
        fs::current_path(currPath);

    if (!result) {
        for (auto& err : cmdLine.getErrors())
            OS::printE(fmt::format("{}\n", err));
        return false;
    }

    return true;
}